

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclThread.h
# Opt level: O2

void __thiscall
xmrig::OclThread::OclThread
          (OclThread *this,uint32_t index,uint32_t intensity,uint32_t worksize,uint32_t stridedIndex
          ,uint32_t memChunk,uint32_t threads,uint32_t unrollFactor)

{
  allocator_type local_39;
  value_type_conflict2 local_38;
  
  this->m_datasetHost = false;
  this->m_gcnAsm = true;
  (this->m_fields).super__Base_bitset<1UL>._M_w = 1;
  local_38 = -1;
  std::vector<long,_std::allocator<long>_>::vector
            (&this->m_threads,(ulong)threads,&local_38,&local_39);
  this->m_bfactor = 6;
  this->m_index = index;
  this->m_memChunk = memChunk;
  this->m_stridedIndex = stridedIndex;
  this->m_unrollFactor = unrollFactor;
  this->m_worksize = worksize;
  this->m_intensity = intensity - intensity % worksize;
  return;
}

Assistant:

OclThread(uint32_t index, uint32_t intensity, uint32_t worksize, uint32_t stridedIndex, uint32_t memChunk, uint32_t threads, uint32_t unrollFactor) :
        m_threads(threads, -1),
        m_index(index),
        m_memChunk(memChunk),
        m_stridedIndex(stridedIndex),
        m_unrollFactor(unrollFactor),
        m_worksize(worksize)
    {
        setIntensity(intensity);
    }